

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void dot_range_(Integer *me,Integer *LO1,Integer *HI1,Integer *ndim1,Integer *LO2,Integer *HI2,
               Integer *ndim2)

{
  undefined8 *in_RCX;
  Integer *in_RDX;
  Integer *in_RSI;
  ulong *in_RDI;
  Integer *in_R8;
  Integer *in_R9;
  char msg [100];
  int lo2 [7];
  int hi2 [7];
  int lo1 [7];
  int hi1 [7];
  char acStackY_128 [8];
  char *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  int local_b8 [8];
  int local_98 [8];
  int local_78 [8];
  int local_58 [10];
  Integer *local_30;
  Integer *local_28;
  undefined8 *local_20;
  Integer *local_18;
  Integer *local_10;
  
  if (7 < (int)*in_RCX) {
    __assert_fail("(int)*ndim1 <= GA_MAX_DIM",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                  ,0x19b,
                  "void dot_range_(Integer *, Integer *, Integer *, Integer *, Integer *, Integer *, Integer *)"
                 );
  }
  if ((int)*(undefined8 *)msg._8_8_ < 8) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    sprintf(acStackY_128,"%d: dot ",*in_RDI & 0xffffffff);
    f2c_copy_indices(local_18,local_58,(int)*local_20);
    f2c_copy_indices(local_10,local_78,(int)*local_20);
    print_range_internal
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    sprintf(acStackY_128,", ");
    f2c_copy_indices(local_30,local_98,(int)*(undefined8 *)msg._8_8_);
    f2c_copy_indices(local_28,local_b8,(int)*(undefined8 *)msg._8_8_);
    print_range_internal
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    return;
  }
  __assert_fail("(int)*ndim2 <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x19c,
                "void dot_range_(Integer *, Integer *, Integer *, Integer *, Integer *, Integer *, Integer *)"
               );
}

Assistant:

void FATR dot_range_(Integer *me, Integer LO1[], Integer HI1[], Integer *ndim1, Integer LO2[], Integer HI2[], Integer *ndim2)
{
int hi1[GA_MAX_DIM], lo1[GA_MAX_DIM], hi2[GA_MAX_DIM], lo2[GA_MAX_DIM];
char msg[100];

    assert((int)*ndim1 <= GA_MAX_DIM);
    assert((int)*ndim2 <= GA_MAX_DIM);
    sprintf(msg,"%d: dot ",(int)*me);
    f2c_copy_indices(HI1, hi1, (int)*ndim1);
    f2c_copy_indices(LO1, lo1, (int)*ndim1);
    print_range_internal(msg,(int)*ndim1, lo1, hi1, "");
    sprintf(msg,", ");
    f2c_copy_indices(HI2, hi2, (int)*ndim2);
    f2c_copy_indices(LO2, lo2, (int)*ndim2);
    print_range_internal(msg,(int)*ndim2, lo2, hi2, "\n");
}